

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall google::protobuf::EnumOptions::SharedCtor(EnumOptions *this)

{
  this->_cached_size_ = 0;
  this->allow_alias_ = false;
  this->deprecated_ = false;
  return;
}

Assistant:

void EnumOptions::SharedCtor() {
  _cached_size_ = 0;
  ::memset(&allow_alias_, 0, reinterpret_cast<char*>(&deprecated_) -
    reinterpret_cast<char*>(&allow_alias_) + sizeof(deprecated_));
}